

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall cmQtAutoGenerator::~cmQtAutoGenerator(cmQtAutoGenerator *this)

{
  this->_vptr_cmQtAutoGenerator = (_func_int **)&PTR__cmQtAutoGenerator_0095d668;
  ProjectDirsT::~ProjectDirsT(&this->ProjectDirs_);
  std::__cxx11::string::~string((string *)&this->ExecutableConfig_);
  std::__cxx11::string::~string((string *)&this->InfoConfig_);
  std::__cxx11::string::~string((string *)&this->InfoDir_);
  std::__cxx11::string::~string((string *)&this->InfoFile_);
  return;
}

Assistant:

cmQtAutoGenerator::~cmQtAutoGenerator() = default;